

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O3

optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *
TryParseHex<std::byte>
          (optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *__return_storage_ptr__,
          string_view str)

{
  byte c;
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  long in_FS_OFFSET;
  byte local_59;
  vector<std::byte,_std::allocator<std::byte>_> local_58;
  long local_38;
  
  pbVar4 = (byte *)str._M_str;
  uVar3 = str._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  std::vector<std::byte,_std::allocator<std::byte>_>::reserve(&local_58,uVar3 >> 1);
  if (uVar3 != 0) {
    pbVar5 = pbVar4 + uVar3;
    do {
      c = *pbVar4;
      if ((c - 9 < 5) || (c == 0x20)) {
        pbVar4 = pbVar4 + 1;
      }
      else {
        bVar1 = HexDigit(c);
        if ((pbVar4 + 1 == pbVar5) || (bVar2 = HexDigit(pbVar4[1]), (char)(bVar2 | bVar1) < '\0')) {
          (__return_storage_ptr__->
          super__Optional_base<std::vector<std::byte,_std::allocator<std::byte>_>,_false,_false>).
          _M_payload.
          super__Optional_payload<std::vector<std::byte,_std::allocator<std::byte>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>.
          _M_engaged = false;
          if (local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          goto LAB_00158749;
        }
        local_59 = bVar2 | bVar1 << 4;
        std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>
                  (&local_58,&local_59);
        pbVar4 = pbVar4 + 2;
      }
    } while (pbVar4 != pbVar5);
  }
  *(pointer *)
   &(__return_storage_ptr__->
    super__Optional_base<std::vector<std::byte,_std::allocator<std::byte>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<std::byte,_std::allocator<std::byte>_>,_true,_false,_false>.
    super__Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>._M_payload.
    _M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl =
       local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<std::vector<std::byte,_std::allocator<std::byte>_>,_false,_false>).
           _M_payload.
           super__Optional_payload<std::vector<std::byte,_std::allocator<std::byte>_>,_true,_false,_false>
           .super__Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>.
           _M_payload._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl + 8
   ) = local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<std::vector<std::byte,_std::allocator<std::byte>_>,_false,_false>).
           _M_payload.
           super__Optional_payload<std::vector<std::byte,_std::allocator<std::byte>_>,_true,_false,_false>
           .super__Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>.
           _M_payload._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl +
   0x10) = local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->
  super__Optional_base<std::vector<std::byte,_std::allocator<std::byte>_>,_false,_false>)._M_payload
  .super__Optional_payload<std::vector<std::byte,_std::allocator<std::byte>_>,_true,_false,_false>.
  super__Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>._M_engaged =
       true;
LAB_00158749:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<Byte>> TryParseHex(std::string_view str)
{
    std::vector<Byte> vch;
    vch.reserve(str.size() / 2); // two hex characters form a single byte

    auto it = str.begin();
    while (it != str.end()) {
        if (IsSpace(*it)) {
            ++it;
            continue;
        }
        auto c1 = HexDigit(*(it++));
        if (it == str.end()) return std::nullopt;
        auto c2 = HexDigit(*(it++));
        if (c1 < 0 || c2 < 0) return std::nullopt;
        vch.push_back(Byte(c1 << 4) | Byte(c2));
    }
    return vch;
}